

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O3

bool __thiscall httplib::Server::routing(Server *this,Request *req,Response *res,Stream *strm)

{
  pointer ppVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  Stream *strm_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined8 *puVar6;
  Handlers *handlers;
  function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>
  *pfVar7;
  pointer ppVar8;
  undefined8 *local_180;
  undefined8 uStack_178;
  code *local_170;
  code *pcStack_168;
  undefined8 *local_160;
  undefined8 uStack_158;
  code *local_150;
  code *pcStack_148;
  Stream *local_140;
  undefined8 *local_138;
  undefined8 uStack_130;
  code *local_128;
  code *local_120;
  undefined8 *local_118;
  undefined8 uStack_110;
  code *local_108;
  code *local_100;
  undefined8 *local_f8;
  undefined8 uStack_f0;
  code *local_e8;
  code *local_e0;
  undefined8 *local_d8;
  undefined8 uStack_d0;
  code *local_c8;
  code *local_c0;
  undefined8 *local_b8;
  undefined8 uStack_b0;
  code *local_a8;
  code *local_a0;
  undefined8 *local_98;
  undefined8 uStack_90;
  code *local_88;
  code *local_80;
  undefined8 *local_78;
  undefined8 uStack_70;
  code *local_68;
  code *local_60;
  undefined8 *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *local_40;
  
  if (((this->pre_routing_handler_).super__Function_base._M_manager != (_Manager_type)0x0) &&
     (bVar3 = (*(this->pre_routing_handler_)._M_invoker)
                        ((_Any_data *)&this->pre_routing_handler_,req,res), bVar3)) {
    return true;
  }
  iVar4 = std::__cxx11::string::compare((char *)req);
  iVar5 = std::__cxx11::string::compare((char *)req);
  if (((iVar4 == 0) || (iVar5 == 0)) &&
     (bVar3 = handle_file_request(this,req,res,iVar4 == 0), bVar3)) {
    return true;
  }
  iVar4 = std::__cxx11::string::compare((char *)req);
  if (((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare((char *)req), iVar4 != 0)) &&
     ((iVar4 = std::__cxx11::string::compare((char *)req), iVar4 != 0 &&
      ((iVar4 = std::__cxx11::string::compare((char *)req), iVar4 != 0 &&
       (iVar4 = std::__cxx11::string::compare((char *)req), iVar4 != 0)))))) goto LAB_00118c55;
  puVar6 = (undefined8 *)operator_new(0x20);
  *puVar6 = this;
  puVar6[1] = strm;
  puVar6[2] = req;
  puVar6[3] = res;
  local_160 = (undefined8 *)operator_new(0x20);
  *local_160 = this;
  local_160[1] = strm;
  local_160[2] = req;
  local_160[3] = res;
  pcStack_168 = std::
                _Function_handler<bool_(std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/httplib/httplib.hpp:4701:21)>
                ::_M_invoke;
  uStack_178 = 0;
  local_170 = std::
              _Function_handler<bool_(std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/httplib/httplib.hpp:4701:21)>
              ::_M_manager;
  pcStack_148 = std::
                _Function_handler<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/httplib/httplib.hpp:4705:21)>
                ::_M_invoke;
  uStack_158 = 0;
  local_150 = std::
              _Function_handler<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/httplib/httplib.hpp:4705:21)>
              ::_M_manager;
  local_180 = puVar6;
  local_140 = strm;
  iVar4 = std::__cxx11::string::compare((char *)req);
  if (iVar4 == 0) {
    local_60 = std::
               _Function_handler<bool_(std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/httplib/httplib.hpp:4701:21)>
               ::_M_invoke;
    local_78 = local_180;
    uStack_70 = uStack_178;
    local_68 = std::
               _Function_handler<bool_(std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/httplib/httplib.hpp:4701:21)>
               ::_M_manager;
    local_170 = (code *)0x0;
    pcStack_168 = (code *)0x0;
    local_40 = std::
               _Function_handler<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/httplib/httplib.hpp:4705:21)>
               ::_M_invoke;
    local_58 = local_160;
    uStack_50 = uStack_158;
    local_48 = std::
               _Function_handler<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/httplib/httplib.hpp:4705:21)>
               ::_M_manager;
    local_150 = (code *)0x0;
    pcStack_148 = (code *)0x0;
    ppVar8 = (this->post_handlers_for_content_reader_).
             super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar1 = (this->post_handlers_for_content_reader_).
             super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar8 != ppVar1) {
      pfVar7 = &ppVar8->second;
      do {
        _Var2._M_current = (req->path)._M_dataplus._M_p;
        bVar3 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                          (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )(_Var2._M_current + (req->path)._M_string_length),&req->matches,
                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)(pfVar7 + -0x20),
                           0);
        if (bVar3) {
          if (*(long *)(pfVar7 + 0x10) == 0) {
            std::__throw_bad_function_call();
          }
          bVar3 = true;
          (**(code **)(pfVar7 + 0x18))(pfVar7,req,res,&local_78);
          goto LAB_00118a5e;
        }
        ppVar8 = (pointer)(pfVar7 + 0x20);
        pfVar7 = pfVar7 + 0x40;
      } while (ppVar8 != ppVar1);
    }
    bVar3 = false;
LAB_00118a5e:
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
    }
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,3);
    }
LAB_00118bc4:
    if (bVar3) {
      if (local_150 != (code *)0x0) {
        (*local_150)(&local_160,&local_160,3);
      }
      if (local_170 != (code *)0x0) {
        (*local_170)(&local_180,&local_180,3);
      }
      return true;
    }
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)req);
    if (iVar4 == 0) {
      local_a0 = std::
                 _Function_handler<bool_(std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/httplib/httplib.hpp:4701:21)>
                 ::_M_invoke;
      local_b8 = local_180;
      uStack_b0 = uStack_178;
      local_a8 = std::
                 _Function_handler<bool_(std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/httplib/httplib.hpp:4701:21)>
                 ::_M_manager;
      local_170 = (code *)0x0;
      pcStack_168 = (code *)0x0;
      local_80 = std::
                 _Function_handler<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/httplib/httplib.hpp:4705:21)>
                 ::_M_invoke;
      local_98 = local_160;
      uStack_90 = uStack_158;
      local_88 = std::
                 _Function_handler<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/httplib/httplib.hpp:4705:21)>
                 ::_M_manager;
      local_150 = (code *)0x0;
      pcStack_148 = (code *)0x0;
      ppVar8 = (this->put_handlers_for_content_reader_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar1 = (this->put_handlers_for_content_reader_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar8 != ppVar1) {
        pfVar7 = &ppVar8->second;
        do {
          _Var2._M_current = (req->path)._M_dataplus._M_p;
          bVar3 = std::__detail::
                  __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                            (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )(_Var2._M_current + (req->path)._M_string_length),&req->matches
                             ,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                              (pfVar7 + -0x20),0);
          if (bVar3) {
            if (*(long *)(pfVar7 + 0x10) == 0) {
              std::__throw_bad_function_call();
            }
            bVar3 = true;
            (**(code **)(pfVar7 + 0x18))(pfVar7,req,res,&local_b8);
            goto LAB_00118ac7;
          }
          ppVar8 = (pointer)(pfVar7 + 0x20);
          pfVar7 = pfVar7 + 0x40;
        } while (ppVar8 != ppVar1);
      }
      bVar3 = false;
LAB_00118ac7:
      if (local_88 != (code *)0x0) {
        (*local_88)(&local_98,&local_98,3);
      }
      if (local_a8 != (code *)0x0) {
        (*local_a8)(&local_b8,&local_b8,3);
      }
      goto LAB_00118bc4;
    }
    iVar4 = std::__cxx11::string::compare((char *)req);
    if (iVar4 == 0) {
      local_e0 = std::
                 _Function_handler<bool_(std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/httplib/httplib.hpp:4701:21)>
                 ::_M_invoke;
      local_f8 = local_180;
      uStack_f0 = uStack_178;
      local_e8 = std::
                 _Function_handler<bool_(std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/httplib/httplib.hpp:4701:21)>
                 ::_M_manager;
      local_170 = (code *)0x0;
      pcStack_168 = (code *)0x0;
      local_c0 = std::
                 _Function_handler<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/httplib/httplib.hpp:4705:21)>
                 ::_M_invoke;
      local_d8 = local_160;
      uStack_d0 = uStack_158;
      local_c8 = std::
                 _Function_handler<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/httplib/httplib.hpp:4705:21)>
                 ::_M_manager;
      local_150 = (code *)0x0;
      pcStack_148 = (code *)0x0;
      ppVar8 = (this->patch_handlers_for_content_reader_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar1 = (this->patch_handlers_for_content_reader_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar8 != ppVar1) {
        pfVar7 = &ppVar8->second;
        do {
          _Var2._M_current = (req->path)._M_dataplus._M_p;
          bVar3 = std::__detail::
                  __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                            (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )(_Var2._M_current + (req->path)._M_string_length),&req->matches
                             ,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                              (pfVar7 + -0x20),0);
          if (bVar3) {
            if (*(long *)(pfVar7 + 0x10) == 0) {
              std::__throw_bad_function_call();
            }
            bVar3 = true;
            (**(code **)(pfVar7 + 0x18))(pfVar7,req,res,&local_f8);
            goto LAB_00118b30;
          }
          ppVar8 = (pointer)(pfVar7 + 0x20);
          pfVar7 = pfVar7 + 0x40;
        } while (ppVar8 != ppVar1);
      }
      bVar3 = false;
LAB_00118b30:
      if (local_c8 != (code *)0x0) {
        (*local_c8)(&local_d8,&local_d8,3);
      }
      if (local_e8 != (code *)0x0) {
        (*local_e8)(&local_f8,&local_f8,3);
      }
      goto LAB_00118bc4;
    }
    iVar4 = std::__cxx11::string::compare((char *)req);
    if (iVar4 == 0) {
      local_120 = std::
                  _Function_handler<bool_(std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/httplib/httplib.hpp:4701:21)>
                  ::_M_invoke;
      local_138 = local_180;
      uStack_130 = uStack_178;
      local_128 = std::
                  _Function_handler<bool_(std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/httplib/httplib.hpp:4701:21)>
                  ::_M_manager;
      local_170 = (code *)0x0;
      pcStack_168 = (code *)0x0;
      local_100 = std::
                  _Function_handler<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/httplib/httplib.hpp:4705:21)>
                  ::_M_invoke;
      local_118 = local_160;
      uStack_110 = uStack_158;
      local_108 = std::
                  _Function_handler<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/httplib/httplib.hpp:4705:21)>
                  ::_M_manager;
      local_150 = (code *)0x0;
      pcStack_148 = (code *)0x0;
      ppVar8 = (this->delete_handlers_for_content_reader_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar1 = (this->delete_handlers_for_content_reader_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar8 != ppVar1) {
        pfVar7 = &ppVar8->second;
        do {
          _Var2._M_current = (req->path)._M_dataplus._M_p;
          bVar3 = std::__detail::
                  __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                            (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )(_Var2._M_current + (req->path)._M_string_length),&req->matches
                             ,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                              (pfVar7 + -0x20),0);
          if (bVar3) {
            if (*(long *)(pfVar7 + 0x10) == 0) {
              std::__throw_bad_function_call();
            }
            bVar3 = true;
            (**(code **)(pfVar7 + 0x18))(pfVar7,req,res,&local_138);
            goto LAB_00118b8f;
          }
          ppVar8 = (pointer)(pfVar7 + 0x20);
          pfVar7 = pfVar7 + 0x40;
        } while (ppVar8 != ppVar1);
      }
      bVar3 = false;
LAB_00118b8f:
      if (local_108 != (code *)0x0) {
        (*local_108)(&local_118,&local_118,3);
      }
      if (local_128 != (code *)0x0) {
        (*local_128)(&local_138,&local_138,3);
      }
      goto LAB_00118bc4;
    }
  }
  if (local_150 != (code *)0x0) {
    (*local_150)(&local_160,&local_160,3);
  }
  strm_00 = local_140;
  if (local_170 != (code *)0x0) {
    (*local_170)(&local_180,&local_180,3);
  }
  bVar3 = read_content(this,strm_00,req,res);
  if (!bVar3) {
    return false;
  }
LAB_00118c55:
  iVar4 = std::__cxx11::string::compare((char *)req);
  if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)req), iVar4 == 0)) {
    handlers = &this->get_handlers_;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)req);
    if (iVar4 == 0) {
      handlers = &this->post_handlers_;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)req);
      if (iVar4 == 0) {
        handlers = &this->put_handlers_;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)req);
        if (iVar4 == 0) {
          handlers = &this->delete_handlers_;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)req);
          if (iVar4 == 0) {
            handlers = &this->options_handlers_;
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)req);
            if (iVar4 != 0) {
              res->status = 400;
              return false;
            }
            handlers = &this->patch_handlers_;
          }
        }
      }
    }
  }
  bVar3 = dispatch_request(this,req,res,handlers);
  return bVar3;
}

Assistant:

inline bool Server::routing(Request& req, Response& res, Stream& strm) {
        if (pre_routing_handler_ && pre_routing_handler_(req, res)) { return true; }

        // File handler
        bool is_head_request = req.method == "HEAD";
        if ((req.method == "GET" || is_head_request) &&
            handle_file_request(req, res, is_head_request)) {
            return true;
        }

        if (detail::expect_content(req)) {
            // Content reader handler
            {
                ContentReader reader(
                    [&](ContentReceiver receiver) {
                        return read_content_with_content_receiver(
                            strm, req, res, std::move(receiver), nullptr, nullptr);
                    },
                    [&](MultipartContentHeader header, ContentReceiver receiver) {
                        return read_content_with_content_receiver(strm, req, res, nullptr,
                            std::move(header),
                            std::move(receiver));
                    });

                if (req.method == "POST") {
                    if (dispatch_request_for_content_reader(
                        req, res, std::move(reader),
                        post_handlers_for_content_reader_)) {
                        return true;
                    }
                }
                else if (req.method == "PUT") {
                    if (dispatch_request_for_content_reader(
                        req, res, std::move(reader),
                        put_handlers_for_content_reader_)) {
                        return true;
                    }
                }
                else if (req.method == "PATCH") {
                    if (dispatch_request_for_content_reader(
                        req, res, std::move(reader),
                        patch_handlers_for_content_reader_)) {
                        return true;
                    }
                }
                else if (req.method == "DELETE") {
                    if (dispatch_request_for_content_reader(
                        req, res, std::move(reader),
                        delete_handlers_for_content_reader_)) {
                        return true;
                    }
                }
            }

            // Read content into `req.body`
            if (!read_content(strm, req, res)) { return false; }
        }

        // Regular handler
        if (req.method == "GET" || req.method == "HEAD") {
            return dispatch_request(req, res, get_handlers_);
        }
        else if (req.method == "POST") {
            return dispatch_request(req, res, post_handlers_);
        }
        else if (req.method == "PUT") {
            return dispatch_request(req, res, put_handlers_);
        }
        else if (req.method == "DELETE") {
            return dispatch_request(req, res, delete_handlers_);
        }
        else if (req.method == "OPTIONS") {
            return dispatch_request(req, res, options_handlers_);
        }
        else if (req.method == "PATCH") {
            return dispatch_request(req, res, patch_handlers_);
        }

        res.status = 400;
        return false;
    }